

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct.cpp
# Opt level: O0

bool spvtools::val::ValidateConstructSize(ConstructType type,size_t size)

{
  size_t size_local;
  ConstructType type_local;
  
  switch(type) {
  case kSelection:
    size_local._7_1_ = size == 0;
    break;
  case kContinue:
    size_local._7_1_ = size == 1;
    break;
  case kLoop:
    size_local._7_1_ = size == 1;
    break;
  case kCase:
    size_local._7_1_ = size != 0;
    break;
  default:
    __assert_fail("1 == 0 && \"Type not defined\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/construct.cpp"
                  ,0x35,"bool spvtools::val::ValidateConstructSize(ConstructType, size_t)");
  }
  return size_local._7_1_;
}

Assistant:

bool ValidateConstructSize(ConstructType type, size_t size) {
  switch (type) {
    case ConstructType::kSelection:
      return size == 0;
    case ConstructType::kContinue:
      return size == 1;
    case ConstructType::kLoop:
      return size == 1;
    case ConstructType::kCase:
      return size >= 1;
    default:
      assert(1 == 0 && "Type not defined");
  }
  return false;
}